

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

int loader_initialize(void)

{
  int iVar1;
  loader_manager_impl plVar2;
  plugin_manager_interface ppVar3;
  int result;
  plugin unaff_retaddr;
  loader_manager_impl manager_impl;
  int local_4;
  
  if (loader_manager_initialized == 0) {
    local_4 = 0;
  }
  else {
    plVar2 = loader_manager_impl_initialize();
    if (plVar2 == (loader_manager_impl)0x0) {
      log_write_impl_va("metacall",0x66,"loader_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                        ,3,"Loader manager failed to initialize");
      local_4 = 1;
    }
    else {
      ppVar3 = loader_manager_impl_iface();
      iVar1 = plugin_manager_initialize
                        (&loader_manager,"loader","LOADER_LIBRARY_PATH","/usr/local/lib",ppVar3,
                         plVar2);
      if (iVar1 == 0) {
        iVar1 = plugin_manager_register(&loader_manager,plVar2->host);
        if (iVar1 == 0) {
          loader_initialization_register_plugin(unaff_retaddr);
          loader_manager_initialized = 0;
          local_4 = 0;
        }
        else {
          log_write_impl_va("metacall",0x80,"loader_initialize",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                            ,3,"Loader host failed to initialize");
          plugin_destroy(plVar2->host);
          plugin_manager_destroy(&loader_manager);
          local_4 = 1;
        }
      }
      else {
        log_write_impl_va("metacall",0x78,"loader_initialize",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                          ,3,"Loader plugin manager failed to initialize");
        loader_manager_impl_destroy((loader_manager_impl)0x104a88);
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int loader_initialize(void)
{
	if (loader_manager_initialized == 0)
	{
		return 0;
	}

	loader_manager_impl manager_impl = loader_manager_impl_initialize();

	if (manager_impl == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader manager failed to initialize");
		return 1;
	}

	int result = plugin_manager_initialize(
		&loader_manager,
		LOADER_MANAGER_NAME,
		LOADER_LIBRARY_PATH,
#if defined(LOADER_LIBRARY_INSTALL_PATH)
		LOADER_LIBRARY_INSTALL_PATH,
#else
		LOADER_LIBRARY_DEFAULT_PATH,
#endif /* LOADER_LIBRARY_INSTALL_PATH */
		loader_manager_impl_iface(),
		manager_impl);

	if (result != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader plugin manager failed to initialize");
		loader_manager_impl_destroy(manager_impl);
		return 1;
	}

	/* Register host loader */
	if (plugin_manager_register(&loader_manager, manager_impl->host) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader host failed to initialize");
		plugin_destroy(manager_impl->host);
		plugin_manager_destroy(&loader_manager);
		return 1;
	}

	/* Insert into destruction list */
	loader_initialization_register_plugin(manager_impl->host);

	/* TODO: Disable logs here until log is completely thread safe and async signal safe */
	/* log_write("metacall", LOG_LEVEL_DEBUG, "Loader host initialized"); */

	loader_manager_initialized = 0;

	return 0;
}